

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_slt_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 t;
  TCGv_i64 t0;
  target_ulong uimm;
  TCGContext_conflict6 *tcg_ctx;
  int16_t imm_local;
  int rs_local;
  int rt_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if (rt != 0) {
    t = tcg_temp_new_i64(tcg_ctx_00);
    gen_load_gpr(tcg_ctx_00,t,rs);
    if (opc == 0x28000000) {
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_LT,tcg_ctx_00->cpu_gpr[rt],t,(long)imm);
    }
    else if (opc == 0x2c000000) {
      tcg_gen_setcondi_i64_mips64el(tcg_ctx_00,TCG_COND_LTU,tcg_ctx_00->cpu_gpr[rt],t,(long)imm);
    }
    tcg_temp_free_i64(tcg_ctx_00,t);
  }
  return;
}

Assistant:

static void gen_slt_imm(DisasContext *ctx, uint32_t opc,
                        int rt, int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = (target_long)imm; /* Sign extend to 32/64 bits */
    TCGv t0;

    if (rt == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rs);
    switch (opc) {
    case OPC_SLTI:
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LT, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    case OPC_SLTIU:
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_LTU, tcg_ctx->cpu_gpr[rt], t0, uimm);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}